

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

void __thiscall FStateDefinitions::MakeStateDefines(FStateDefinitions *this,PClassActor *cls)

{
  uint uVar1;
  
  if ((this->StateArray).Count != 0) {
    (this->StateArray).Count = 0;
  }
  this->laststate = (FState *)0x0;
  this->laststatebeforelabel = (FState *)0x0;
  this->lastlabel = -1;
  if ((cls != (PClassActor *)0x0) && (cls->StateList != (FStateLabels *)0x0)) {
    MakeStateList(cls->StateList,&this->StateLabels);
    return;
  }
  uVar1 = (this->StateLabels).Count;
  if (uVar1 != 0) {
    TArray<FStateDefine,_FStateDefine>::DoDelete(&this->StateLabels,0,uVar1 - 1);
    (this->StateLabels).Count = 0;
  }
  return;
}

Assistant:

void FStateDefinitions::MakeStateDefines(const PClassActor *cls)
{
	StateArray.Clear();
	laststate = NULL;
	laststatebeforelabel = NULL;
	lastlabel = -1;

	if (cls != NULL && cls->StateList != NULL)
	{
		MakeStateList(cls->StateList, StateLabels);
	}
	else
	{
		StateLabels.Clear();
	}
}